

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O3

int tcv_init(tcv_t *tcv)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  uint uVar2;
  uint8_t identifier;
  uint8_t local_19;
  
  uVar2 = 0xfffffffc;
  if ((tcv != (tcv_t *)0x0) && (tcv->created == true)) {
    __mutex = &tcv->lock;
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar1 == 0) {
      uVar2 = (*tcv->read)(tcv->index,'P','\0',&local_19,1);
      if ((int)uVar2 < 0) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
      else {
        if (tcv->data != (void *)0x0) {
          free(tcv->data);
          tcv->data = (void *)0x0;
        }
        uVar2 = 0xffffffff;
        if (local_19 == '\x03') {
          uVar2 = sfp_init(tcv);
          iVar1 = pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          uVar2 = -(uint)(iVar1 != 0) | uVar2;
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int tcv_init(tcv_t *tcv)
{
	uint8_t identifier;
	int ret = 0;

	if (!tcv_check_and_lock_ok(tcv))
		return TCV_ERR_INVALID_ARG;

	ret = tcv->read(tcv->index, TCV_DEVADDR_A0, TCV_IDENTIFIER, &identifier, 1);
	if (ret < 0) {
		tcv_unlock(tcv);
		return ret;
	}

	/* if someone calls init on a transceiver with alloc'ed data - clear it first */
	if (tcv->data) {
		free(tcv->data);
		tcv->data = NULL;
	}

	switch (identifier) {
		case TCV_TYPE_SFP:
			ret = sfp_init(tcv);
			break;

//		TODO
//		case TCV_TYPE_XFP:
//			((sfp_data_t*)tcv->data) = malloc(sizeof(xfp_data_t));
//			((xfp_data_t*)((sfp_data_t*)tcv->data))->type = TCV_TYPE_XFP;
//			break;

		default:
			return TCV_ERR_GENERIC;
	}
	if (tcv_unlock(tcv))
		return TCV_ERR_GENERIC;

	return ret;
}